

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O3

iterator * __thiscall
QPDFNameTreeObjectHelper::begin(iterator *__return_storage_ptr__,QPDFNameTreeObjectHelper *this)

{
  undefined1 local_81;
  NNTreeIterator *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  iterator local_70;
  
  NNTreeImpl::begin(&local_70,
                    (((this->m).
                      super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  local_80 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NNTreeIterator,std::allocator<NNTreeIterator>,NNTreeIterator>
            (&local_78,&local_80,(allocator<NNTreeIterator> *)&local_81,&local_70);
  __return_storage_ptr__->_vptr_iterator = (_func_int **)&PTR__iterator_002ec5b0;
  (__return_storage_ptr__->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_80;
  (__return_storage_ptr__->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_78._M_pi;
  if (local_78._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->ivalue).first._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->ivalue).first.field_2;
    (__return_storage_ptr__->ivalue).first._M_string_length = 0;
    (__return_storage_ptr__->ivalue).first.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      UNLOCK();
      (__return_storage_ptr__->ivalue).first._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->ivalue).first.field_2;
      (__return_storage_ptr__->ivalue).first._M_string_length = 0;
      (__return_storage_ptr__->ivalue).first.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_78._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001bbe5b;
    }
    else {
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      (__return_storage_ptr__->ivalue).first._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->ivalue).first.field_2;
      (__return_storage_ptr__->ivalue).first._M_string_length = 0;
      (__return_storage_ptr__->ivalue).first.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->ivalue).second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
LAB_001bbe5b:
  NNTreeIterator::~NNTreeIterator(&local_70);
  return __return_storage_ptr__;
}

Assistant:

QPDFNameTreeObjectHelper::iterator
QPDFNameTreeObjectHelper::begin() const
{
    return {std::make_shared<NNTreeIterator>(m->impl->begin())};
}